

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O0

Cycles __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_true>::perform_bus_operation
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_true> *this,
          BusOperation operation,uint16_t address,uint8_t *value)

{
  Card *pCVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  State *pSVar7;
  reference this_00;
  pointer pCVar8;
  bool bVar9;
  SwitchState SVar10;
  uint local_214;
  pointer local_190;
  pointer local_188;
  unique_ptr<Apple::II::Card,_std::default_delete<Apple::II::Card>_> *local_180;
  value_type *card_2;
  iterator __end4_1;
  iterator __begin4_1;
  array<std::unique_ptr<Apple::II::Card,_std::default_delete<Apple::II::Card>_>,_8UL> *__range4_1;
  reference local_158;
  Card **card_1;
  iterator __end4;
  iterator __begin4;
  vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_> *__range4;
  WrappedInt<Cycles> WStack_130;
  bool is_read_1;
  reference local_128;
  Card **card;
  iterator __end5;
  iterator __begin5;
  vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_> *__range5;
  Card *target;
  bool is_read;
  size_t sStack_f8;
  Select select;
  size_t card_number;
  size_t input;
  bool has_updated_cards;
  bool is_stretched_cycle;
  byte *local_28;
  uint8_t *value_local;
  uint16_t address_local;
  ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_true> *pCStack_18;
  BusOperation operation_local;
  ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_true> *this_local;
  
  local_28 = value;
  value_local._2_2_ = address;
  value_local._4_4_ = operation;
  pCStack_18 = this;
  WrappedInt<Cycles>::operator++(&(this->cycles_since_video_update_).super_WrappedInt<Cycles>);
  WrappedInt<Cycles>::operator++(&(this->cycles_since_card_update_).super_WrappedInt<Cycles>);
  Cycles::Cycles((Cycles *)&stack0xffffffffffffffd0,7);
  WrappedInt<Cycles>::operator+=
            (&(this->cycles_since_audio_update_).super_WrappedInt<Cycles>,
             (Cycles *)&stack0xffffffffffffffd0);
  this->cycles_into_current_line_ = (this->cycles_into_current_line_ + 1) % 0x41;
  bVar9 = this->cycles_into_current_line_ == 0;
  if (bVar9) {
    WrappedInt<Cycles>::operator++(&(this->cycles_since_audio_update_).super_WrappedInt<Cycles>);
    this->stretched_cycles_since_card_update_ = this->stretched_cycles_since_card_update_ + 1;
  }
  bVar4 = false;
  if (this->read_pages_[(int)(uint)value_local._2_2_ >> 8] == (uint8_t *)0x0) {
    if (((int)value_local._4_4_ < 5) && (value_local._2_2_ != 0xc000)) {
      bVar5 = VideoSwitches<Cycles>::has_deferred_actions((VideoSwitches<Cycles> *)&this->video_);
      if (bVar5) {
        update_video(this);
      }
      bVar2 = II::Video::
              Video<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_true>::VideoBusHandler,_true>
              ::get_last_read_value
                        (&this->video_,
                         (Cycles)(this->cycles_since_video_update_).super_WrappedInt<Cycles>.length_
                        );
      *local_28 = bVar2;
    }
    switch(value_local._2_2_) {
    case 0xc010:
      Keyboard::clear_keyboard_input(&this->keyboard_);
      if ((int)value_local._4_4_ < 5) {
        bVar5 = Keyboard::get_key_is_down(&this->keyboard_);
        bVar2 = 0;
        if (bVar5) {
          bVar2 = 0x80;
        }
        bVar3 = Keyboard::get_keyboard_input(&this->keyboard_);
        *local_28 = bVar2 | bVar3 & 0x7f;
      }
      break;
    default:
      if ((int)value_local._4_4_ < 5) {
        switch(value_local._2_2_) {
        case 0xc000:
          bVar2 = Keyboard::get_keyboard_input(&this->keyboard_);
          *local_28 = bVar2;
          break;
        case 0xc001:
        case 0xc002:
        case 0xc003:
        case 0xc004:
        case 0xc005:
        case 0xc006:
        case 0xc007:
        case 0xc008:
        case 0xc009:
        case 0xc00a:
        case 0xc00b:
        case 0xc00c:
        case 0xc00d:
        case 0xc00e:
        case 0xc00f:
          bVar2 = *local_28;
          bVar3 = Keyboard::get_keyboard_input(&this->keyboard_);
          *local_28 = bVar2 & 0x80 | bVar3 & 0x7f;
          break;
        default:
          break;
        case 0xc011:
          bVar2 = Keyboard::get_keyboard_input(&this->keyboard_);
          *local_28 = bVar2;
          bVar2 = *local_28;
          pSVar7 = LanguageCardSwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_true>_>
                   ::state(&this->language_card_);
          bVar3 = 0;
          if ((pSVar7->bank2 & 1U) != 0) {
            bVar3 = 0x80;
          }
          *local_28 = bVar2 & 0x7f | bVar3;
          break;
        case 0xc012:
          bVar2 = Keyboard::get_keyboard_input(&this->keyboard_);
          *local_28 = bVar2;
          bVar2 = *local_28;
          pSVar7 = LanguageCardSwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_true>_>
                   ::state(&this->language_card_);
          bVar3 = 0;
          if ((pSVar7->read & 1U) != 0) {
            bVar3 = 0x80;
          }
          *local_28 = bVar2 & 0x7f | bVar3;
          break;
        case 0xc013:
          bVar2 = Keyboard::get_keyboard_input(&this->keyboard_);
          *local_28 = bVar2;
          bVar2 = *local_28;
          SVar10 = AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_true>_>
                   ::switches(&this->auxiliary_switches_);
          bVar3 = 0;
          if (((unkuint9)SVar10 & 1) != 0) {
            bVar3 = 0x80;
          }
          *local_28 = bVar2 & 0x7f | bVar3;
          break;
        case 0xc014:
          bVar2 = Keyboard::get_keyboard_input(&this->keyboard_);
          *local_28 = bVar2;
          bVar2 = *local_28;
          SVar10 = AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_true>_>
                   ::switches(&this->auxiliary_switches_);
          bVar3 = 0;
          if (((unkuint9)SVar10 & 0x100) != 0) {
            bVar3 = 0x80;
          }
          *local_28 = bVar2 & 0x7f | bVar3;
          break;
        case 0xc015:
          bVar2 = Keyboard::get_keyboard_input(&this->keyboard_);
          *local_28 = bVar2;
          bVar2 = *local_28;
          SVar10 = AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_true>_>
                   ::switches(&this->auxiliary_switches_);
          bVar3 = 0;
          if (((unkuint9)SVar10 & 0x10000) != 0) {
            bVar3 = 0x80;
          }
          *local_28 = bVar2 & 0x7f | bVar3;
          break;
        case 0xc016:
          bVar2 = Keyboard::get_keyboard_input(&this->keyboard_);
          *local_28 = bVar2;
          bVar2 = *local_28;
          SVar10 = AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_true>_>
                   ::switches(&this->auxiliary_switches_);
          bVar3 = 0;
          if (((unkuint9)SVar10 & 0x1000000000000) != 0) {
            bVar3 = 0x80;
          }
          *local_28 = bVar2 & 0x7f | bVar3;
          break;
        case 0xc017:
          bVar2 = Keyboard::get_keyboard_input(&this->keyboard_);
          *local_28 = bVar2;
          bVar2 = *local_28;
          SVar10 = AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_true>_>
                   ::switches(&this->auxiliary_switches_);
          bVar3 = 0;
          if (((unkuint9)SVar10 & 0x1000000) != 0) {
            bVar3 = 0x80;
          }
          *local_28 = bVar2 & 0x7f | bVar3;
          break;
        case 0xc018:
          bVar2 = Keyboard::get_keyboard_input(&this->keyboard_);
          *local_28 = bVar2;
          bVar2 = *local_28;
          bVar5 = VideoSwitches<Cycles>::get_80_store((VideoSwitches<Cycles> *)&this->video_);
          bVar3 = 0;
          if (bVar5) {
            bVar3 = 0x80;
          }
          *local_28 = bVar2 & 0x7f | bVar3;
          break;
        case 0xc019:
          bVar2 = Keyboard::get_keyboard_input(&this->keyboard_);
          *local_28 = bVar2;
          bVar2 = *local_28;
          bVar5 = II::Video::
                  Video<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_true>::VideoBusHandler,_true>
                  ::get_is_vertical_blank
                            (&this->video_,
                             (Cycles)(this->cycles_since_video_update_).super_WrappedInt<Cycles>.
                                     length_);
          bVar3 = 0;
          if (bVar5) {
            bVar3 = 0x80;
          }
          *local_28 = bVar2 & 0x7f | bVar3;
          break;
        case 0xc01a:
          bVar2 = Keyboard::get_keyboard_input(&this->keyboard_);
          *local_28 = bVar2;
          bVar2 = *local_28;
          bVar5 = VideoSwitches<Cycles>::get_text((VideoSwitches<Cycles> *)&this->video_);
          bVar3 = 0;
          if (bVar5) {
            bVar3 = 0x80;
          }
          *local_28 = bVar2 & 0x7f | bVar3;
          break;
        case 0xc01b:
          bVar2 = Keyboard::get_keyboard_input(&this->keyboard_);
          *local_28 = bVar2;
          bVar2 = *local_28;
          bVar5 = VideoSwitches<Cycles>::get_mixed((VideoSwitches<Cycles> *)&this->video_);
          bVar3 = 0;
          if (bVar5) {
            bVar3 = 0x80;
          }
          *local_28 = bVar2 & 0x7f | bVar3;
          break;
        case 0xc01c:
          bVar2 = Keyboard::get_keyboard_input(&this->keyboard_);
          *local_28 = bVar2;
          bVar2 = *local_28;
          bVar5 = VideoSwitches<Cycles>::get_page2((VideoSwitches<Cycles> *)&this->video_);
          bVar3 = 0;
          if (bVar5) {
            bVar3 = 0x80;
          }
          *local_28 = bVar2 & 0x7f | bVar3;
          break;
        case 0xc01d:
          bVar2 = Keyboard::get_keyboard_input(&this->keyboard_);
          *local_28 = bVar2;
          bVar2 = *local_28;
          bVar5 = VideoSwitches<Cycles>::get_high_resolution((VideoSwitches<Cycles> *)&this->video_)
          ;
          bVar3 = 0;
          if (bVar5) {
            bVar3 = 0x80;
          }
          *local_28 = bVar2 & 0x7f | bVar3;
          break;
        case 0xc01e:
          bVar2 = Keyboard::get_keyboard_input(&this->keyboard_);
          *local_28 = bVar2;
          bVar2 = *local_28;
          bVar5 = VideoSwitches<Cycles>::get_alternative_character_set
                            ((VideoSwitches<Cycles> *)&this->video_);
          bVar3 = 0;
          if (bVar5) {
            bVar3 = 0x80;
          }
          *local_28 = bVar2 & 0x7f | bVar3;
          break;
        case 0xc01f:
          bVar2 = Keyboard::get_keyboard_input(&this->keyboard_);
          *local_28 = bVar2;
          bVar2 = *local_28;
          bVar5 = VideoSwitches<Cycles>::get_80_columns((VideoSwitches<Cycles> *)&this->video_);
          bVar3 = 0;
          if (bVar5) {
            bVar3 = 0x80;
          }
          *local_28 = bVar2 & 0x7f | bVar3;
          break;
        case 0xc061:
          *local_28 = *local_28 & 0x7f;
          bVar5 = JoystickPair::button(&this->joysticks_,0);
          if ((bVar5) || (((this->keyboard_).open_apple_is_pressed & 1U) != 0)) {
            *local_28 = *local_28 | 0x80;
          }
          break;
        case 0xc062:
          *local_28 = *local_28 & 0x7f;
          bVar5 = JoystickPair::button(&this->joysticks_,1);
          if ((bVar5) || (((this->keyboard_).closed_apple_is_pressed & 1U) != 0)) {
            *local_28 = *local_28 | 0x80;
          }
          break;
        case 0xc063:
          *local_28 = *local_28 & 0x7f;
          bVar5 = JoystickPair::button(&this->joysticks_,2);
          if (bVar5) {
            *local_28 = *local_28 | 0x80;
          }
          break;
        case 0xc064:
        case 0xc065:
        case 0xc066:
        case 0xc067:
          *local_28 = *local_28 & 0x7f;
          bVar5 = JoystickPair::analogue_channel_is_discharged
                            (&this->joysticks_,(long)(int)(value_local._2_2_ - 0xc064));
          if (!bVar5) {
            *local_28 = *local_28 | 0x80;
          }
          break;
        case 0xc07f:
          bVar2 = *local_28;
          bVar5 = VideoSwitches<Cycles>::get_annunciator_3((VideoSwitches<Cycles> *)&this->video_);
          bVar3 = 0;
          if (bVar5) {
            bVar3 = 0x80;
          }
          *local_28 = bVar2 & 0x7f | bVar3;
        }
      }
      else {
        AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_true>_>
        ::access(&this->auxiliary_switches_,(char *)(ulong)value_local._2_2_,0);
        uVar6 = (uint)value_local._2_2_;
        if (uVar6 - 0xc000 < 2) {
          update_video(this);
          VideoSwitches<Cycles>::set_80_store
                    ((VideoSwitches<Cycles> *)&this->video_,(value_local._2_2_ & 1) != 0);
        }
        else if (uVar6 - 0xc00c < 2) {
          update_video(this);
          VideoSwitches<Cycles>::set_80_columns
                    ((VideoSwitches<Cycles> *)&this->video_,(value_local._2_2_ & 1) != 0);
        }
        else if (uVar6 - 0xc00e < 2) {
          update_video(this);
          VideoSwitches<Cycles>::set_alternative_character_set
                    ((VideoSwitches<Cycles> *)&this->video_,(value_local._2_2_ & 1) != 0);
        }
      }
      break;
    case 0xc030:
    case 0xc031:
    case 0xc032:
    case 0xc033:
    case 0xc034:
    case 0xc035:
    case 0xc036:
    case 0xc037:
    case 0xc038:
    case 0xc039:
    case 0xc03a:
    case 0xc03b:
    case 0xc03c:
    case 0xc03d:
    case 0xc03e:
    case 0xc03f:
      update_audio(this);
      bVar5 = Audio::Toggle::get_output(&this->audio_toggle_);
      Audio::Toggle::set_output(&this->audio_toggle_,(bool)((bVar5 ^ 0xffU) & 1));
      break;
    case 0xc050:
    case 0xc051:
      update_video(this);
      VideoSwitches<Cycles>::set_text
                ((VideoSwitches<Cycles> *)&this->video_,(value_local._2_2_ & 1) != 0);
      break;
    case 0xc052:
      update_video(this);
      VideoSwitches<Cycles>::set_mixed((VideoSwitches<Cycles> *)&this->video_,false);
      break;
    case 0xc053:
      update_video(this);
      VideoSwitches<Cycles>::set_mixed((VideoSwitches<Cycles> *)&this->video_,true);
      break;
    case 0xc054:
    case 0xc055:
      update_video(this);
      VideoSwitches<Cycles>::set_page2
                ((VideoSwitches<Cycles> *)&this->video_,(value_local._2_2_ & 1) != 0);
      AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_true>_>
      ::access(&this->auxiliary_switches_,(char *)(ulong)value_local._2_2_,
               (uint)((int)value_local._4_4_ < 5));
      break;
    case 0xc056:
    case 0xc057:
      update_video(this);
      VideoSwitches<Cycles>::set_high_resolution
                ((VideoSwitches<Cycles> *)&this->video_,(value_local._2_2_ & 1) != 0);
      AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_true>_>
      ::access(&this->auxiliary_switches_,(char *)(ulong)value_local._2_2_,
               (uint)((int)value_local._4_4_ < 5));
      break;
    case 0xc05e:
    case 0xc05f:
      update_video(this);
      VideoSwitches<Cycles>::set_annunciator_3
                ((VideoSwitches<Cycles> *)&this->video_,
                 (bool)(((value_local._2_2_ & 1) != 0 ^ 0xffU) & 1));
      break;
    case 0xc070:
      JoystickPair::access_c070(&this->joysticks_);
      break;
    case 0xc080:
    case 0xc081:
    case 0xc082:
    case 0xc083:
    case 0xc084:
    case 0xc085:
    case 0xc086:
    case 0xc087:
    case 0xc088:
    case 0xc089:
    case 0xc08a:
    case 0xc08b:
    case 0xc08c:
    case 0xc08d:
    case 0xc08e:
    case 0xc08f:
      LanguageCardSwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_true>_>
      ::access(&this->language_card_,(char *)(ulong)value_local._2_2_,
               (uint)((int)value_local._4_4_ < 5));
    }
    if (((this->read_pages_[(int)(uint)value_local._2_2_ >> 8] == (uint8_t *)0x0) &&
        (0xc08f < value_local._2_2_)) && (value_local._2_2_ < 0xd000)) {
      if (value_local._2_2_ < 0xc800) {
        if (value_local._2_2_ < 0xc100) {
          sStack_f8 = (size_t)((int)(value_local._2_2_ - 0xc090) >> 4);
          target._4_4_ = 1;
        }
        else {
          sStack_f8 = (size_t)((int)(value_local._2_2_ - 0xc100) >> 8);
          this->active_card_ = sStack_f8;
          target._4_4_ = 2;
        }
      }
      else {
        sStack_f8 = this->active_card_;
        target._4_4_ = 4;
        if (value_local._2_2_ == 0xcfff) {
          this->active_card_ = 7;
        }
      }
      bVar4 = (int)value_local._4_4_ < 5;
      this_00 = std::
                array<std::unique_ptr<Apple::II::Card,_std::default_delete<Apple::II::Card>_>,_8UL>
                ::operator[](&this->cards_,sStack_f8);
      pCVar8 = std::unique_ptr<Apple::II::Card,_std::default_delete<Apple::II::Card>_>::get(this_00)
      ;
      if ((pCVar8 != (pointer)0x0) && (bVar5 = is_every_cycle_card(this,pCVar8), !bVar5)) {
        update_just_in_time_cards(this);
        (*pCVar8->_vptr_Card[4])
                  (pCVar8,(ulong)target._4_4_,(ulong)bVar4,(ulong)value_local._2_2_,local_28);
      }
      __end5 = std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>::begin
                         (&this->every_cycle_cards_);
      card = (Card **)std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>::end
                                (&this->every_cycle_cards_);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end5,(__normal_iterator<Apple::II::Card_**,_std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>_>
                                         *)&card), bVar5) {
        local_128 = __gnu_cxx::
                    __normal_iterator<Apple::II::Card_**,_std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>_>
                    ::operator*(&__end5);
        pCVar1 = *local_128;
        Cycles::Cycles((Cycles *)&stack0xfffffffffffffed0,1);
        (*pCVar1->_vptr_Card[2])(pCVar1,WStack_130.length_,(ulong)bVar9);
        if (*local_128 == pCVar8) {
          local_214 = target._4_4_;
        }
        else {
          local_214 = 0;
        }
        (*(*local_128)->_vptr_Card[4])
                  (*local_128,(ulong)local_214,(ulong)bVar4,(ulong)value_local._2_2_,local_28);
        __gnu_cxx::
        __normal_iterator<Apple::II::Card_**,_std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>_>
        ::operator++(&__end5);
      }
      bVar4 = true;
    }
  }
  else {
    if ((int)value_local._4_4_ < 5) {
      *local_28 = this->read_pages_[(int)(uint)value_local._2_2_ >> 8]
                  [(int)(value_local._2_2_ & 0xff)];
    }
    else {
      if ((0x1ff < value_local._2_2_) && (value_local._2_2_ < 0x6000)) {
        update_video(this);
      }
      if (this->write_pages_[(int)(uint)value_local._2_2_ >> 8] != (uint8_t *)0x0) {
        this->write_pages_[(int)(uint)value_local._2_2_ >> 8][(int)(value_local._2_2_ & 0xff)] =
             *local_28;
      }
    }
    AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_true>_>
    ::access(&this->auxiliary_switches_,(char *)(ulong)value_local._2_2_,
             (uint)((int)value_local._4_4_ < 5));
  }
  if ((!bVar4) &&
     (bVar4 = std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>::empty
                        (&this->every_cycle_cards_), !bVar4)) {
    bVar4 = (int)value_local._4_4_ < 5;
    __end4 = std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>::begin
                       (&this->every_cycle_cards_);
    card_1 = (Card **)std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>::end
                                (&this->every_cycle_cards_);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end4,(__normal_iterator<Apple::II::Card_**,_std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>_>
                                       *)&card_1), bVar5) {
      local_158 = __gnu_cxx::
                  __normal_iterator<Apple::II::Card_**,_std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>_>
                  ::operator*(&__end4);
      pCVar1 = *local_158;
      Cycles::Cycles((Cycles *)&__range4_1,1);
      (*pCVar1->_vptr_Card[2])(pCVar1,__range4_1,(ulong)bVar9);
      (*(*local_158)->_vptr_Card[4])(*local_158,0,(ulong)bVar4,(ulong)value_local._2_2_,local_28);
      __gnu_cxx::
      __normal_iterator<Apple::II::Card_**,_std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>_>
      ::operator++(&__end4);
    }
  }
  if ((this->card_lists_are_dirty_ & 1U) != 0) {
    this->card_lists_are_dirty_ = false;
    if ((this->card_became_just_in_time_ & 1U) != 0) {
      this->card_became_just_in_time_ = false;
      update_just_in_time_cards(this);
    }
    std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>::clear
              (&this->every_cycle_cards_);
    std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>::clear
              (&this->just_in_time_cards_);
    __begin4_1 = (this->cards_)._M_elems;
    __end4_1 = std::
               array<std::unique_ptr<Apple::II::Card,_std::default_delete<Apple::II::Card>_>,_8UL>::
               begin((array<std::unique_ptr<Apple::II::Card,_std::default_delete<Apple::II::Card>_>,_8UL>
                      *)__begin4_1);
    card_2 = std::
             array<std::unique_ptr<Apple::II::Card,_std::default_delete<Apple::II::Card>_>,_8UL>::
             end((array<std::unique_ptr<Apple::II::Card,_std::default_delete<Apple::II::Card>_>,_8UL>
                  *)__begin4_1);
    for (; __end4_1 != card_2; __end4_1 = __end4_1 + 1) {
      local_180 = __end4_1;
      bVar9 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)__end4_1);
      if (bVar9) {
        pCVar8 = std::unique_ptr<Apple::II::Card,_std::default_delete<Apple::II::Card>_>::get
                           (local_180);
        bVar9 = is_every_cycle_card(this,pCVar8);
        if (bVar9) {
          local_188 = std::unique_ptr<Apple::II::Card,_std::default_delete<Apple::II::Card>_>::get
                                (local_180);
          std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>::push_back
                    (&this->every_cycle_cards_,&local_188);
        }
        else {
          local_190 = std::unique_ptr<Apple::II::Card,_std::default_delete<Apple::II::Card>_>::get
                                (local_180);
          std::vector<Apple::II::Card_*,_std::allocator<Apple::II::Card_*>_>::push_back
                    (&this->just_in_time_cards_,&local_190);
        }
      }
    }
  }
  JoystickPair::update_charge(&this->joysticks_,1.0);
  Cycles::Cycles((Cycles *)&this_local,1);
  return (Cycles)(WrappedInt<Cycles>)this_local;
}

Assistant:

forceinline Cycles perform_bus_operation(const CPU::MOS6502::BusOperation operation, const uint16_t address, uint8_t *const value) {
			++ cycles_since_video_update_;
			++ cycles_since_card_update_;
			cycles_since_audio_update_ += Cycles(7);

			// The Apple II has a slightly weird timing pattern: every 65th CPU cycle is stretched
			// by an extra 1/7th. That's because one cycle lasts 3.5 NTSC colour clocks, so after
			// 65 cycles a full line of 227.5 colour clocks have passed. But the high-rate binary
			// signal approximation that produces colour needs to be in phase, so a stretch of exactly
			// 0.5 further colour cycles is added. The video class handles that implicitly, but it
			// needs to be accumulated here for the audio.
			cycles_into_current_line_ = (cycles_into_current_line_ + 1) % 65;
			const bool is_stretched_cycle = !cycles_into_current_line_;
			if(is_stretched_cycle) {
				++ cycles_since_audio_update_;
				++ stretched_cycles_since_card_update_;
			}

			bool has_updated_cards = false;
			if(read_pages_[address >> 8]) {
				if(isReadOperation(operation)) *value = read_pages_[address >> 8][address & 0xff];
				else {
					if(address >= 0x200 && address < 0x6000) update_video();
					if(write_pages_[address >> 8]) write_pages_[address >> 8][address & 0xff] = *value;
				}

				if(is_iie(model)) {
					auxiliary_switches_.access(address, isReadOperation(operation));
				}
			} else {
				// Assume a vapour read unless it turns out otherwise; this is a little
				// wasteful but works for now.
				//
				// Longer version: like many other machines, when the Apple II reads from
				// an address at which no hardware loads the data bus, through a process of
				// practical analogue effects it'll end up receiving whatever was last on
				// the bus. Which will always be whatever the video circuit fetched because
				// that fetches in between every instruction.
				//
				// So this code assumes that'll happen unless it later determines that it
				// doesn't. The call into the video isn't free because it's a just-in-time
				// actor, but this will actually be the result most of the time so it's not
				// too terrible.
				if(isReadOperation(operation) && address != 0xc000) {
					// Ensure any enqueued video changes are applied before grabbing the
					// vapour value.
					if(video_.has_deferred_actions()) {
						update_video();
					}
					*value = video_.get_last_read_value(cycles_since_video_update_);
				}

				switch(address) {
					default:
						if(isReadOperation(operation)) {
							// Read-only switches.
							switch(address) {
								default: break;

								case 0xc000:
									*value = keyboard_.get_keyboard_input();
								break;
								case 0xc001: case 0xc002: case 0xc003: case 0xc004: case 0xc005: case 0xc006: case 0xc007:
								case 0xc008: case 0xc009: case 0xc00a: case 0xc00b: case 0xc00c: case 0xc00d: case 0xc00e: case 0xc00f:
									*value = (*value & 0x80) | (keyboard_.get_keyboard_input() & 0x7f);
								break;

								case 0xc061:	// Switch input 0.
									*value &= 0x7f;
									if(
										joysticks_.button(0) ||
										(is_iie(model) && keyboard_.open_apple_is_pressed)
									)
										*value |= 0x80;
								break;
								case 0xc062:	// Switch input 1.
									*value &= 0x7f;
									if(
										joysticks_.button(1) ||
										(is_iie(model) && keyboard_.closed_apple_is_pressed)
									)
										*value |= 0x80;
								break;
								case 0xc063:	// Switch input 2.
									*value &= 0x7f;
									if(joysticks_.button(2))
										*value |= 0x80;
								break;

								case 0xc064:	// Analogue input 0.
								case 0xc065:	// Analogue input 1.
								case 0xc066:	// Analogue input 2.
								case 0xc067: {	// Analogue input 3.
									const size_t input = address - 0xc064;
									*value &= 0x7f;
									if(!joysticks_.analogue_channel_is_discharged(input)) {
										*value |= 0x80;
									}
								} break;

								// The IIe-only state reads follow...
#define IIeSwitchRead(s)	*value = keyboard_.get_keyboard_input(); if(is_iie(model)) *value = (*value & 0x7f) | (s ? 0x80 : 0x00);
								case 0xc011:	IIeSwitchRead(language_card_.state().bank2);								break;
								case 0xc012:	IIeSwitchRead(language_card_.state().read);									break;
								case 0xc013:	IIeSwitchRead(auxiliary_switches_.switches().read_auxiliary_memory);		break;
								case 0xc014:	IIeSwitchRead(auxiliary_switches_.switches().write_auxiliary_memory);		break;
								case 0xc015:	IIeSwitchRead(auxiliary_switches_.switches().internal_CX_rom);				break;
								case 0xc016:	IIeSwitchRead(auxiliary_switches_.switches().alternative_zero_page);		break;
								case 0xc017:	IIeSwitchRead(auxiliary_switches_.switches().slot_C3_rom);					break;
								case 0xc018:	IIeSwitchRead(video_.get_80_store());										break;
								case 0xc019:	IIeSwitchRead(video_.get_is_vertical_blank(cycles_since_video_update_));	break;
								case 0xc01a:	IIeSwitchRead(video_.get_text());											break;
								case 0xc01b:	IIeSwitchRead(video_.get_mixed());											break;
								case 0xc01c:	IIeSwitchRead(video_.get_page2());											break;
								case 0xc01d:	IIeSwitchRead(video_.get_high_resolution());								break;
								case 0xc01e:	IIeSwitchRead(video_.get_alternative_character_set());						break;
								case 0xc01f:	IIeSwitchRead(video_.get_80_columns());										break;
#undef IIeSwitchRead

								case 0xc07f:
									if(is_iie(model)) *value = (*value & 0x7f) | (video_.get_annunciator_3() ? 0x80 : 0x00);
								break;
							}
						} else {
							// Write-only switches. All IIe as currently implemented.
							if(is_iie(model)) {
								auxiliary_switches_.access(address, false);
								switch(address) {
									default: break;

									case 0xc000:
									case 0xc001:
										update_video();
										video_.set_80_store(address&1);
									break;

									case 0xc00c:
									case 0xc00d:
										update_video();
										video_.set_80_columns(address&1);
									break;

									case 0xc00e:
									case 0xc00f:
										update_video();
										video_.set_alternative_character_set(address&1);
									break;
								}
							}
						}
					break;

					case 0xc070: joysticks_.access_c070(); break;

					/* Switches triggered by reading or writing. */
					case 0xc050:
					case 0xc051:
						update_video();
						video_.set_text(address&1);
					break;
					case 0xc052:	update_video();		video_.set_mixed(false);		break;
					case 0xc053:	update_video();		video_.set_mixed(true);			break;
					case 0xc054:
					case 0xc055:
						update_video();
						video_.set_page2(address&1);
						auxiliary_switches_.access(address, isReadOperation(operation));
					break;
					case 0xc056:
					case 0xc057:
						update_video();
						video_.set_high_resolution(address&1);
						auxiliary_switches_.access(address, isReadOperation(operation));
					break;

					case 0xc05e:
					case 0xc05f:
						if(is_iie(model)) {
							update_video();
							video_.set_annunciator_3(!(address&1));
						}
					break;

					case 0xc010:
						keyboard_.clear_keyboard_input();

						// On the IIe, reading C010 returns additional key info.
						if(is_iie(model) && isReadOperation(operation)) {
							*value = (keyboard_.get_key_is_down() ? 0x80 : 0x00) | (keyboard_.get_keyboard_input() & 0x7f);
						}
					break;

					case 0xc030: case 0xc031: case 0xc032: case 0xc033: case 0xc034: case 0xc035: case 0xc036: case 0xc037:
					case 0xc038: case 0xc039: case 0xc03a: case 0xc03b: case 0xc03c: case 0xc03d: case 0xc03e: case 0xc03f:
						update_audio();
						audio_toggle_.set_output(!audio_toggle_.get_output());
					break;

					case 0xc080: case 0xc084: case 0xc088: case 0xc08c:
					case 0xc081: case 0xc085: case 0xc089: case 0xc08d:
					case 0xc082: case 0xc086: case 0xc08a: case 0xc08e:
					case 0xc083: case 0xc087: case 0xc08b: case 0xc08f:
						language_card_.access(address, isReadOperation(operation));
					break;
				}

				/*
					Communication with cards follows.
				*/

				if(!read_pages_[address >> 8] && address >= 0xc090 && address < 0xd000) {
					// If this is a card access, figure out which card is at play before determining
					// the totality of who needs messaging.
					size_t card_number = 0;
					Apple::II::Card::Select select = Apple::II::Card::None;

					if(address >= 0xc800) {
						/*
							Decode the 2kb area used for additional ROMs.
							This is shared by all cards.
						*/
						card_number = active_card_;
						select = Apple::II::Card::C8Region;

						// An access to $cfff will disable the active card.
						if(address == 0xcfff) {
							active_card_ = NoActiveCard;
						}
					} else if(address >= 0xc100) {
						/*
							Decode the area conventionally used by cards for ROMs:
								0xCn00 to 0xCnff: card n.

							This also sets the active card for the C8 region.
						*/
						active_card_ = card_number = (address - 0xc100) >> 8;
						select = Apple::II::Card::IO;
					} else {
						/*
							Decode the area conventionally used by cards for registers:
								C0n0 to C0nF: card n - 8.
						*/
						card_number = (address - 0xc090) >> 4;
						select = Apple::II::Card::Device;
					}

					// If the selected card is a just-in-time card, update the just-in-time cards,
					// and then message it specifically.
					const bool is_read = isReadOperation(operation);
					Apple::II::Card *const target = cards_[size_t(card_number)].get();
					if(target && !is_every_cycle_card(target)) {
						update_just_in_time_cards();
						target->perform_bus_operation(select, is_read, address, value);
					}

					// Update all the every-cycle cards regardless, but send them a ::None select if they're
					// not the one actually selected.
					for(const auto &card: every_cycle_cards_) {
						card->run_for(Cycles(1), is_stretched_cycle);
						card->perform_bus_operation(
							(card == target) ? select : Apple::II::Card::None,
							is_read, address, value);
					}
					has_updated_cards = true;
				}
			}

			if(!has_updated_cards && !every_cycle_cards_.empty()) {
				// Update all every-cycle cards and give them the cycle.
				const bool is_read = isReadOperation(operation);
				for(const auto &card: every_cycle_cards_) {
					card->run_for(Cycles(1), is_stretched_cycle);
					card->perform_bus_operation(Apple::II::Card::None, is_read, address, value);
				}
			}

			// Update the card lists if any mutations are due.
			if(card_lists_are_dirty_) {
				card_lists_are_dirty_ = false;

				// There's only one counter of time since update
				// for just-in-time cards. If something new is
				// transitioning, that needs to be zeroed.
				if(card_became_just_in_time_) {
					card_became_just_in_time_ = false;
					update_just_in_time_cards();
				}

				// Clear the two lists and repopulate.
				every_cycle_cards_.clear();
				just_in_time_cards_.clear();
				for(const auto &card: cards_) {
					if(!card) continue;
					if(is_every_cycle_card(card.get())) {
						every_cycle_cards_.push_back(card.get());
					} else {
						just_in_time_cards_.push_back(card.get());
					}
				}
			}

			// Update analogue charge level.
			joysticks_.update_charge();

			return Cycles(1);
		}